

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O2

bool __thiscall
lzham::task_pool::
queue_multiple_object_tasks<lzham::search_accelerator,void(lzham::search_accelerator::*)(unsigned_long_long,void*)>
          (task_pool *this,search_accelerator *pObject,
          offset_in_search_accelerator_to_subr pObject_method,uint64 first_data,uint num_tasks,
          void *pData_ptr)

{
  bool bVar1;
  object_task<lzham::search_accelerator> *poVar2;
  undefined4 in_register_00000084;
  ulong releaseCount;
  ulong uVar3;
  undefined8 in_stack_00000008;
  task tsk;
  undefined4 local_74;
  search_accelerator *local_70;
  task local_68;
  search_accelerator *local_40;
  uint64 local_38;
  
  if ((int)pData_ptr == 0) {
    bVar1 = true;
  }
  else {
    releaseCount = (ulong)pData_ptr & 0xffffffff;
    local_70 = pObject;
    local_40 = (search_accelerator *)pObject_method;
    local_38 = first_data;
    for (uVar3 = 0; releaseCount != uVar3; uVar3 = uVar3 + 1) {
      local_68.field_2._0_4_ = 0;
      local_68.field_2._4_4_ = 0;
      local_68.m_flags = 0;
      local_68.m_data = 0;
      local_68.m_pData_ptr._0_4_ = 0;
      local_68.m_pData_ptr._4_4_ = 0;
      local_74 = 1;
      poVar2 = lzham_new<lzham::object_task<lzham::search_accelerator>,lzham::search_accelerator*,void(lzham::search_accelerator::*)(unsigned_long_long,void*),lzham::object_task_flags>
                         ((lzham *)&local_70,&local_40,
                          (offset_in_search_accelerator_to_subr *)&local_74,
                          (object_task_flags *)first_data);
      local_68.field_2._0_4_ = SUB84(poVar2,0);
      local_68.field_2._4_4_ = (undefined4)((ulong)poVar2 >> 0x20);
      if (poVar2 == (object_task<lzham::search_accelerator> *)0x0) {
LAB_0011264e:
        if (uVar3 == 0) {
          return false;
        }
        bVar1 = releaseCount <= uVar3;
        releaseCount = uVar3;
        goto LAB_00112667;
      }
      local_68.m_data = CONCAT44(in_register_00000084,num_tasks) + uVar3;
      local_68.m_pData_ptr._0_4_ = (undefined4)in_stack_00000008;
      local_68.m_pData_ptr._4_4_ = (undefined4)((ulong)in_stack_00000008 >> 0x20);
      local_68.m_flags = 1;
      bVar1 = tsstack<lzham::task_pool::task,_16U>::try_push(&this->m_task_stack,&local_68);
      if (!bVar1) goto LAB_0011264e;
    }
    bVar1 = true;
LAB_00112667:
    LOCK();
    this->m_num_outstanding_tasks = this->m_num_outstanding_tasks + releaseCount;
    UNLOCK();
    semaphore::release(&this->m_tasks_available,releaseCount);
  }
  return bVar1;
}

Assistant:

inline bool task_pool::queue_multiple_object_tasks(S* pObject, T pObject_method, uint64 first_data, uint num_tasks, void* pData_ptr)
   {
      LZHAM_ASSERT(m_num_threads);
      LZHAM_ASSERT(pObject);
      LZHAM_ASSERT(num_tasks);
      if (!num_tasks)
         return true;

      bool status = true;

      uint i;
      for (i = 0; i < num_tasks; i++)
      {
         task tsk;

         tsk.m_pObj = lzham_new< object_task<S> >(pObject, pObject_method, cObjectTaskFlagDeleteAfterExecution);
         if (!tsk.m_pObj)
         {
            status = false;
            break;
         }

         tsk.m_data = first_data + i;
         tsk.m_pData_ptr = pData_ptr;
         tsk.m_flags = cTaskFlagObject;

         if (!m_task_stack.try_push(tsk))
         {
            status = false;
            break;
         }
      }

      if (i)
      {
         atomic_add32(&m_num_outstanding_tasks, i);

         m_tasks_available.release(i);
      }

      return status;
   }